

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

char * __thiscall
ImFont::CalcWordWrapPositionA(ImFont *this,float scale,char *text,char *text_end,float wrap_width)

{
  int iVar1;
  float *pfVar2;
  char *in_text;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  uint c;
  uint local_50;
  float local_4c;
  float local_48;
  float local_44;
  char *local_40;
  char *local_38;
  
  bVar5 = true;
  local_44 = 0.0;
  local_38 = (char *)0x0;
  local_48 = 0.0;
  local_4c = 0.0;
  pcVar3 = text;
  local_40 = text;
LAB_001e5ef2:
  do {
    in_text = text;
    if (text_end <= in_text) goto LAB_001e6033;
    local_50 = (uint)*in_text;
    if (*in_text < '\0') {
      iVar1 = ImTextCharFromUtf8(&local_50,in_text,text_end);
      text = in_text + iVar1;
    }
    else {
      text = in_text + 1;
    }
    if (local_50 == 0) goto LAB_001e6033;
    if (local_50 < 0x20) {
      if (local_50 == 10) {
        bVar5 = true;
        local_44 = 0.0;
        local_48 = 0.0;
        local_4c = 0.0;
        goto LAB_001e5ef2;
      }
      if (local_50 == 0xd) goto LAB_001e5ef2;
    }
    pfVar2 = (this->IndexAdvanceX).Data + local_50;
    if ((this->IndexAdvanceX).Size <= (int)local_50) {
      pfVar2 = &this->FallbackAdvanceX;
    }
    if (((local_50 == 9) || (local_50 == 0x3000)) || (local_50 == 0x20)) {
      if (bVar5) {
        local_44 = local_44 + local_4c;
      }
      pcVar4 = pcVar3;
      if (bVar5) {
        pcVar4 = in_text;
        local_4c = 0.0;
      }
      local_4c = local_4c + *pfVar2;
      bVar5 = false;
    }
    else {
      local_48 = local_48 + *pfVar2;
      pcVar4 = text;
      if (!bVar5) {
        local_44 = local_44 + local_4c + local_48;
        local_48 = 0.0;
        local_4c = 0.0;
        pcVar4 = pcVar3;
        local_38 = pcVar3;
      }
      if ((local_50 < 0x40) && ((0x8800500200000000U >> ((ulong)local_50 & 0x3f) & 1) != 0)) {
        bVar5 = false;
      }
      else {
        bVar5 = local_50 != 0x22;
      }
    }
    pcVar3 = pcVar4;
    if (wrap_width / scale < local_44 + local_48) {
      if (local_38 != (char *)0x0) {
        pcVar4 = local_38;
      }
      if (local_48 < wrap_width / scale) {
        in_text = pcVar4;
      }
LAB_001e6033:
      return in_text + (local_40 < text_end && in_text == local_40);
    }
  } while( true );
}

Assistant:

const char* ImFont::CalcWordWrapPositionA(float scale, const char* text, const char* text_end, float wrap_width) const
{
    // For references, possible wrap point marked with ^
    //  "aaa bbb, ccc,ddd. eee   fff. ggg!"
    //      ^    ^    ^   ^   ^__    ^    ^

    // List of hardcoded separators: .,;!?'"

    // Skip extra blanks after a line returns (that includes not counting them in width computation)
    // e.g. "Hello    world" --> "Hello" "World"

    // Cut words that cannot possibly fit within one line.
    // e.g.: "The tropical fish" with ~5 characters worth of width --> "The tr" "opical" "fish"
    float line_width = 0.0f;
    float word_width = 0.0f;
    float blank_width = 0.0f;
    wrap_width /= scale; // We work with unscaled widths to avoid scaling every characters

    const char* word_end = text;
    const char* prev_word_end = NULL;
    bool inside_word = true;

    const char* s = text;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)*s;
        const char* next_s;
        if (c < 0x80)
            next_s = s + 1;
        else
            next_s = s + ImTextCharFromUtf8(&c, s, text_end);
        if (c == 0)
            break;

        if (c < 32)
        {
            if (c == '\n')
            {
                line_width = word_width = blank_width = 0.0f;
                inside_word = true;
                s = next_s;
                continue;
            }
            if (c == '\r')
            {
                s = next_s;
                continue;
            }
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX);
        if (ImCharIsBlankW(c))
        {
            if (inside_word)
            {
                line_width += blank_width;
                blank_width = 0.0f;
                word_end = s;
            }
            blank_width += char_width;
            inside_word = false;
        }
        else
        {
            word_width += char_width;
            if (inside_word)
            {
                word_end = next_s;
            }
            else
            {
                prev_word_end = word_end;
                line_width += word_width + blank_width;
                word_width = blank_width = 0.0f;
            }

            // Allow wrapping after punctuation.
            inside_word = (c != '.' && c != ',' && c != ';' && c != '!' && c != '?' && c != '\"');
        }

        // We ignore blank width at the end of the line (they can be skipped)
        if (line_width + word_width > wrap_width)
        {
            // Words that cannot possibly fit within an entire line will be cut anywhere.
            if (word_width < wrap_width)
                s = prev_word_end ? prev_word_end : word_end;
            break;
        }

        s = next_s;
    }

    // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
    // +1 may not be a character start point in UTF-8 but it's ok because caller loops use (text >= word_wrap_eol).
    if (s == text && text < text_end)
        return s + 1;
    return s;
}